

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O2

string * __thiscall
zmq::detail::socket_base::get<48,2>(string *__return_storage_ptr__,socket_base *this,long param_3)

{
  size_t sVar1;
  char cVar2;
  pointer pcVar3;
  
  cVar2 = ')';
  if (param_3 != 0x400) {
    cVar2 = (char)param_3;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar2);
  pcVar3 = (pointer)__return_storage_ptr__->_M_string_length;
  if (pcVar3 != (pointer)0x0) {
    pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
  }
  sVar1 = get<48,1>(this,pcVar3);
  if (sVar1 != 0x20) {
    if (sVar1 != 0x29) {
      __assert_fail("size == 32 || size == 41",
                    "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq.hpp",
                    0x750,
                    "std::string zmq::detail::socket_base::get(sockopt::array_option<Opt, NullTerm>, size_t) const [Opt = 48, NullTerm = 2]"
                   );
    }
    if ((__return_storage_ptr__->_M_dataplus)._M_p[0x28] != '\0') {
      __assert_fail("str[size - 1] == \'\\0\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq.hpp",
                    0x752,
                    "std::string zmq::detail::socket_base::get(sockopt::array_option<Opt, NullTerm>, size_t) const [Opt = 48, NullTerm = 2]"
                   );
    }
  }
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ZMQ_NODISCARD std::string get(sockopt::array_option<Opt, NullTerm>,
                                  size_t init_size = 1024) const
    {
        if ZMQ_CONSTEXPR_IF (NullTerm == 2) {
            if (init_size == 1024) {
                init_size = 41; // get as Z85 string
            }
        }
        std::string str(init_size, '\0');
        size_t size = get(sockopt::array_option<Opt>{}, buffer(str));
        if ZMQ_CONSTEXPR_IF (NullTerm == 1) {
            if (size > 0) {
                assert(str[size - 1] == '\0');
                --size;
            }
        } else if ZMQ_CONSTEXPR_IF (NullTerm == 2) {
            assert(size == 32 || size == 41);
            if (size == 41) {
                assert(str[size - 1] == '\0');
                --size;
            }
        }
        str.resize(size);
        return str;
    }